

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O2

void __thiscall
NavierStokesBase::ConvectiveScalMinMax
          (NavierStokesBase *this,MultiFab *Snew,int snew_comp,MultiFab *Sold,int sold_comp)

{
  long lVar1;
  double dVar2;
  EBFArrayBoxFactory *this_00;
  FabArray<amrex::FArrayBox> *this_01;
  long lVar3;
  long lVar4;
  long lVar5;
  int jj;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int kk;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int ii;
  long lVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  long local_220;
  long local_218;
  long local_208;
  long local_200;
  Box local_16c;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<double> local_d0;
  MFIter mfi;
  
  amrex::MFIter::MFIter(&mfi,(FabArrayBase *)Snew,true);
  lVar1 = -1;
  while( true ) {
    if (mfi.endIndex <= mfi.currentIndex) {
      amrex::MFIter::~MFIter(&mfi);
      return;
    }
    amrex::MFIter::tilebox(&local_16c,&mfi);
    amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (&local_d0,&Snew->super_FabArray<amrex::FArrayBox>,&mfi,snew_comp);
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_110,&Sold->super_FabArray<amrex::FArrayBox>,&mfi,sold_comp);
    this_00 = (EBFArrayBoxFactory *)
              __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                             _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo,0);
    if (this_00 == (EBFArrayBoxFactory *)0x0) break;
    this_01 = &amrex::EBFArrayBoxFactory::getVolFrac(this_00)->super_FabArray<amrex::FArrayBox>;
    amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(&local_150,this_01,&mfi);
    lVar19 = (long)local_16c.smallend.vect[1];
    lVar21 = (long)local_16c.smallend.vect[2];
    lVar5 = local_110.jstride * 8;
    lVar8 = local_110.kstride * 8;
    lVar16 = (long)local_16c.smallend.vect[0];
    lVar3 = local_150.jstride * 8;
    lVar4 = local_150.kstride * 8;
    local_218 = ((lVar21 - local_110.begin.z) + -1) * lVar8 +
                ((lVar19 - local_110.begin.y) + -1) * lVar5 + lVar16 * 8 +
                (long)local_110.begin.x * -8 + (long)local_110.p;
    local_220 = ((lVar21 - local_150.begin.z) + -1) * lVar4 +
                ((lVar19 - local_150.begin.y) + -1) * lVar3 + lVar16 * 8 +
                (long)local_150.begin.x * -8 + (long)local_150.p;
    for (; lVar21 <= local_16c.bigend.vect[2]; lVar21 = lVar21 + 1) {
      lVar9 = (lVar21 - local_d0.begin.z) * local_d0.kstride;
      local_200 = local_220;
      local_208 = local_218;
      for (lVar12 = lVar19; lVar12 <= local_16c.bigend.vect[1]; lVar12 = lVar12 + 1) {
        if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
          lVar10 = (lVar12 - local_d0.begin.y) * local_d0.jstride;
          lVar11 = local_208;
          lVar13 = local_200;
          lVar20 = lVar16;
          do {
            dVar25 = 1.79769313486232e+308;
            dVar23 = 2.2250738585072014e-308;
            lVar7 = lVar13;
            lVar14 = lVar11;
            for (lVar15 = lVar1; lVar6 = lVar1, lVar17 = lVar14, lVar18 = lVar7, lVar15 != 2;
                lVar15 = lVar15 + 1) {
              for (; lVar22 = lVar1, lVar6 != 2; lVar6 = lVar6 + 1) {
                for (; lVar22 != 2; lVar22 = lVar22 + 1) {
                  dVar24 = dVar23;
                  if (0.0 < *(double *)(lVar18 + lVar22 * 8)) {
                    dVar24 = *(double *)(lVar17 + lVar22 * 8);
                    dVar2 = dVar24;
                    if (dVar25 <= dVar24) {
                      dVar2 = dVar25;
                    }
                    dVar25 = dVar2;
                    if (dVar24 <= dVar23) {
                      dVar24 = dVar23;
                    }
                  }
                  dVar23 = dVar24;
                }
                lVar17 = lVar17 + lVar5;
                lVar18 = lVar18 + lVar3;
              }
              lVar14 = lVar14 + lVar8;
              lVar7 = lVar7 + lVar4;
            }
            if (dVar25 <= local_d0.p[lVar9 + lVar10 + (lVar20 - local_d0.begin.x)]) {
              dVar25 = local_d0.p[lVar9 + lVar10 + (lVar20 - local_d0.begin.x)];
            }
            if (dVar25 <= dVar23) {
              dVar23 = dVar25;
            }
            local_d0.p[lVar9 + lVar10 + (lVar20 - local_d0.begin.x)] = dVar23;
            lVar20 = lVar20 + 1;
            lVar11 = lVar11 + 8;
            lVar13 = lVar13 + 8;
          } while (local_16c.bigend.vect[0] + 1 != (int)lVar20);
        }
        local_208 = local_208 + lVar5;
        local_200 = local_200 + lVar3;
      }
      local_218 = local_218 + lVar8;
      local_220 = local_220 + lVar4;
    }
    amrex::MFIter::operator++(&mfi);
  }
  __cxa_bad_cast();
}

Assistant:

void
NavierStokesBase::ConvectiveScalMinMax ( amrex::MultiFab&       Snew, const int snew_comp,
                                         amrex::MultiFab const& Sold, const int sold_comp )
{

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(Snew,TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {

        const auto& bx = mfi.tilebox();

        const auto& sn   = Snew.array(mfi,snew_comp);
        const auto& so   = Sold.const_array(mfi,sold_comp);
#ifdef AMREX_USE_EB
        const auto& ebfactory = dynamic_cast<amrex::EBFArrayBoxFactory const&>(Factory());
        const auto& vfrac = ebfactory.getVolFrac().const_array(mfi);
#endif

        amrex::ParallelFor(bx, [=]
        AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            Real smn = std::numeric_limits<Real>::max();
            Real smx = std::numeric_limits<Real>::min();

#if (AMREX_SPACEDIM==3)
            int ks = -1;
            int ke =  1;
#else
            int ks = 0;
            int ke = 0;
#endif

            for (int kk = ks; kk <= ke; ++kk)
            {
                for (int jj = -1; jj <= 1; ++jj)
                {
                    for (int ii = -1; ii <= 1; ++ii)
                    {
#ifdef AMREX_USE_EB
                        if ( vfrac (i+ii,j+jj,k+kk) > 0. )
#endif
                        {
                            smn =  amrex::min(smn, so(i+ii,j+jj,k+kk));
                            smx =  amrex::max(smx, so(i+ii,j+jj,k+kk));
                        }
                    }
                }
            }
            sn(i,j,k) = amrex::min( amrex::max(sn(i,j,k), smn), smx );
        });
    }
}